

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::PrintKeys(cmCursesMainForm *this,int process)

{
  uint uVar1;
  FIELD *field;
  size_t sVar2;
  char *pcVar3;
  int local_858;
  int local_854;
  char local_848 [8];
  char fmt [512];
  char *toggleKeyInstruction;
  char *clearLine;
  char thirdLine [512];
  char secondLine [512];
  char firstLine [512];
  FIELD *currentField;
  cmCursesWidget *cw;
  int y;
  int x;
  int process_local;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_854 = -1;
    local_858 = -1;
  }
  else {
    local_854 = *(short *)(_stdscr + 4) + 1;
    local_858 = *(short *)(_stdscr + 6) + 1;
  }
  if (((0x40 < local_858) && (this->InitialWidth <= local_858)) && (5 < local_854)) {
    currentField = (FIELD *)0x0;
    if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
      field = current_field((FORM_conflict *)(this->super_cmCursesForm).Form);
      currentField = (FIELD *)field_userptr(field);
    }
    if (currentField != (FIELD *)0x0) {
      (**(code **)(*(long *)currentField + 0x30))();
    }
    memset(secondLine + 0x1f8,0,0x200);
    memset(thirdLine + 0x1f8,0,0x200);
    memset(&clearLine,0,0x200);
    if (process == 0) {
      if ((this->OkToGenerate & 1U) == 0) {
        sprintf(secondLine + 0x1f8,"Press [c] to configure                                   ");
      }
      else {
        sprintf(secondLine + 0x1f8,"Press [c] to configure       Press [g] to generate and exit");
      }
      fmt._504_8_ = anon_var_dwarf_1597c;
      pcVar3 = "Off";
      if ((this->AdvancedMode & 1U) != 0) {
        pcVar3 = "On";
      }
      sprintf((char *)&clearLine,"Press [t] to toggle advanced mode (Currently %s)",pcVar3);
      sprintf(thirdLine + 0x1f8,"Press [h] for help           Press [q] to quit without generating")
      ;
    }
    else {
      strcpy(secondLine + 0x1f8,
             "                                                                    ");
      strcpy(thirdLine + 0x1f8,
             "                                                                    ");
      strcpy((char *)&clearLine,
             "                                                                    ");
    }
    curses_move(local_854 - 4,0);
    memcpy(local_848,"Press [enter] to edit option",0x200);
    if (process != 0) {
      strcpy(local_848,"                           ");
    }
    printw(local_848);
    curses_move(local_854 - 3,0);
    printw(secondLine + 0x1f8);
    curses_move(local_854 - 2,0);
    printw(thirdLine + 0x1f8);
    curses_move(local_854 - 1,0);
    printw(&clearLine);
    if (currentField != (FIELD *)0x0) {
      uVar1 = cmCursesWidget::GetPage((cmCursesWidget *)currentField);
      sprintf(secondLine + 0x1f8,"Page %d of %d",(ulong)uVar1,(ulong)(uint)this->NumberOfPages);
      sVar2 = strlen(secondLine + 0x1f8);
      curses_move(0,0x40 - (int)sVar2);
      printw(secondLine + 0x1f8);
    }
    pos_form_cursor((FORM_conflict *)(this->super_cmCursesForm).Form);
  }
  return;
}

Assistant:

void cmCursesMainForm::PrintKeys(int process /* = 0 */)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    return;
    }

  // Give the current widget (if it exists), a chance to print keys
  cmCursesWidget* cw = 0;
  if (this->Form)
    {
    FIELD* currentField = current_field(this->Form);
    cw = reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));
    }

  if (cw)
    {
    cw->PrintKeys();
    }

//    {
//    }
//  else
//    {
  char firstLine[512]="";
  char secondLine[512]="";
  char thirdLine[512]="";
  if (process)
    {
    const char* clearLine =
      "                                                                    ";
    strcpy(firstLine, clearLine);
    strcpy(secondLine, clearLine);
    strcpy(thirdLine, clearLine);
    }
  else
    {
    if (this->OkToGenerate)
      {
      sprintf(firstLine,
              "Press [c] to configure       Press [g] to generate and exit");
      }
    else
      {
      sprintf(firstLine,  "Press [c] to configure                                   ");
      }
    {
      const char* toggleKeyInstruction =
        "Press [t] to toggle advanced mode (Currently %s)";
      sprintf(thirdLine,
              toggleKeyInstruction,
              this->AdvancedMode ? "On" : "Off");
    }
    sprintf(secondLine,
            "Press [h] for help           "
            "Press [q] to quit without generating");
    }

  curses_move(y-4,0);
  char fmt[512] = "Press [enter] to edit option";
  if ( process )
    {
    strcpy(fmt, "                           ");
    }
  printw(fmt);
  curses_move(y-3,0);
  printw(firstLine);
  curses_move(y-2,0);
  printw(secondLine);
  curses_move(y-1,0);
  printw(thirdLine);

  if (cw)
    {
    sprintf(firstLine, "Page %d of %d", cw->GetPage(), this->NumberOfPages);
    curses_move(0,65-static_cast<unsigned int>(strlen(firstLine))-1);
    printw(firstLine);
    }
//    }

  pos_form_cursor(this->Form);

}